

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.c
# Opt level: O0

void nni_pipe_run_cb(nni_pipe *p,nng_pipe_ev ev)

{
  _Bool _Var1;
  nni_sock *pnVar2;
  nng_pipe_cb p_Var3;
  void *pvVar4;
  nng_pipe pid;
  _Bool wantevs;
  void *arg;
  nng_pipe_cb cb;
  nni_sock *s;
  nng_pipe_ev ev_local;
  nni_pipe *p_local;
  
  pnVar2 = p->p_sock;
  nni_mtx_lock(&pnVar2->s_pipe_cbs_mtx);
  p_Var3 = pnVar2->s_pipe_cbs[ev].cb_fn;
  pvVar4 = pnVar2->s_pipe_cbs[ev].cb_arg;
  _Var1 = pnVar2->s_want_evs;
  nni_mtx_unlock(&pnVar2->s_pipe_cbs_mtx);
  if ((_Var1 & 1U) != 0) {
    nni_mtx_lock(&nni_pipe_run_cb::serialize);
    if ((p->p_last_event == NNG_PIPE_EV_NONE) && (ev != NNG_PIPE_EV_ADD_PRE)) {
      nni_mtx_unlock(&nni_pipe_run_cb::serialize);
    }
    else if (p->p_last_event < ev) {
      p->p_last_event = ev;
      if (p_Var3 != (nng_pipe_cb)0x0) {
        (*p_Var3)((nng_pipe)p->p_id,ev,pvVar4);
      }
      nni_mtx_unlock(&nni_pipe_run_cb::serialize);
    }
    else {
      nni_mtx_unlock(&nni_pipe_run_cb::serialize);
    }
  }
  return;
}

Assistant:

void
nni_pipe_run_cb(nni_pipe *p, nng_pipe_ev ev)
{
	nni_sock      *s = p->p_sock;
	nng_pipe_cb    cb;
	void          *arg;
	bool           wantevs;
	static nni_mtx serialize = NNI_MTX_INITIALIZER;

	nni_mtx_lock(&s->s_pipe_cbs_mtx);
	cb      = s->s_pipe_cbs[ev].cb_fn;
	arg     = s->s_pipe_cbs[ev].cb_arg;
	wantevs = s->s_want_evs;
	nni_mtx_unlock(&s->s_pipe_cbs_mtx);

	if (wantevs) {
		nni_mtx_lock(&serialize);
		// this pipe never got an event before, so don't start now
		if (p->p_last_event == NNG_PIPE_EV_NONE &&
		    ev != NNG_PIPE_EV_ADD_PRE) {
			nni_mtx_unlock(&serialize);
			return;
		}
		if (p->p_last_event >= ev) {
			// this pipe event already was notified, or a "later"
			// one was, so don't go backwards.
			nni_mtx_unlock(&serialize);
			return;
		}
		p->p_last_event = ev;
		nng_pipe pid;
		pid.id = p->p_id;
		if (cb != NULL) {
			cb(pid, ev, arg);
		}
		nni_mtx_unlock(&serialize);
	}
}